

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

uint32_t __thiscall
google::protobuf::Reflection::GetOneofCase
          (Reflection *this,Message *message,OneofDescriptor *oneof_descriptor)

{
  bool bVar1;
  LogMessageFatal LStack_28;
  
  bVar1 = OneofDescriptor::is_synthetic(oneof_descriptor);
  if (!bVar1) {
    return *(uint32_t *)
            ((long)&(message->super_MessageLite)._vptr_MessageLite +
            (ulong)(uint)((int)(((long)oneof_descriptor -
                                (long)oneof_descriptor->containing_type_->oneof_decls_) / 0x38) * 4
                         + (this->schema_).oneof_case_offset_));
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&LStack_28,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
             ,0xb9c,"!oneof_descriptor->is_synthetic()");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&LStack_28);
}

Assistant:

uint32_t Reflection::GetOneofCase(
    const Message& message, const OneofDescriptor* oneof_descriptor) const {
  ABSL_DCHECK(!oneof_descriptor->is_synthetic());
  return internal::GetConstRefAtOffset<uint32_t>(
      message, schema_.GetOneofCaseOffset(oneof_descriptor));
}